

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ContainsMatcher *
Catch::Matchers::Contains
          (ContainsMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  StdString::CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StdString::ContainsMatcher::ContainsMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StdString::ContainsMatcher Contains(std::string const &str, CaseSensitive::Choice caseSensitivity) {
      return StdString::ContainsMatcher(StdString::CasedString(str, caseSensitivity));
    }